

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diyfp.h
# Opt level: O0

void __thiscall
rapidjson::internal::DiyFp::NormalizedBoundaries(DiyFp *this,DiyFp *minus,DiyFp *plus)

{
  uint64_t *in_RDX;
  long *in_RSI;
  long *in_RDI;
  DiyFp DVar1;
  DiyFp mi;
  DiyFp pl;
  DiyFp local_58;
  uint64_t local_48;
  int local_40;
  DiyFp local_38;
  uint64_t local_28;
  int local_20;
  uint64_t *local_18;
  long *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  DiyFp(&local_38,*in_RDI * 2 + 1,(int)in_RDI[1] + -1);
  DVar1 = NormalizeBoundary(&local_38);
  local_48 = DVar1.f;
  local_40 = DVar1.e;
  local_28 = local_48;
  local_20 = local_40;
  if (*in_RDI == 0x10000000000000) {
    DiyFp(&local_58,*in_RDI * 4 - 1,(int)in_RDI[1] + -2);
  }
  else {
    DiyFp(&local_58,*in_RDI * 2 - 1,(int)in_RDI[1] + -1);
  }
  *local_18 = local_28;
  *(int *)(local_18 + 1) = local_20;
  *local_10 = local_58.f << ((char)local_58.e - (char)local_20 & 0x3fU);
  *(int *)(local_10 + 1) = local_20;
  return;
}

Assistant:

void NormalizedBoundaries(DiyFp* minus, DiyFp* plus) const {
        DiyFp pl = DiyFp((f << 1) + 1, e - 1).NormalizeBoundary();
        DiyFp mi = (f == kDpHiddenBit) ? DiyFp((f << 2) - 1, e - 2) : DiyFp((f << 1) - 1, e - 1);
        mi.f <<= mi.e - pl.e;
        mi.e = pl.e;
        *plus = pl;
        *minus = mi;
    }